

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Parser::parse_read_statement(Parser *this)

{
  pointer pTVar1;
  AbstractSyntaxNode *pAVar2;
  int iVar3;
  stringstream buffer;
  Type local_3ac;
  Token local_3a8;
  Token local_350;
  Token local_2f8;
  Token local_2a0;
  Token local_248;
  Token local_1f0;
  Type local_198 [32];
  ios_base local_118 [264];
  
  local_198[0] = kReadStatement;
  pAVar2 = AbstractSyntaxNode::add_child
                     (this->current_,local_198,
                      (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + this->index_ % this->total_);
  this->current_ = pAVar2;
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  local_3ac = kRead;
  match(&local_1f0,this,&local_3ac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f0.extra_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.content_._M_dataplus._M_p != &local_1f0.content_.field_2) {
    operator_delete(local_1f0.content_._M_dataplus._M_p);
  }
  local_3ac = kLeftParen;
  match(&local_248,this,&local_3ac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248.extra_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.content_._M_dataplus._M_p != &local_248.content_.field_2) {
    operator_delete(local_248.content_._M_dataplus._M_p);
  }
  iVar3 = this->index_ % this->total_;
  pTVar1 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar1[iVar3].type_ == kIdentity) {
    if (pTVar1[(this->index_ + 1) % this->total_].type_ == kLeftBracket) {
      local_3ac = kIdentityArray;
      pAVar2 = AbstractSyntaxNode::add_child(this->current_,&local_3ac,pTVar1 + iVar3);
      this->current_ = pAVar2;
      AbstractSyntaxNode::add_child
                (pAVar2,(this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl
                        .super__Vector_impl_data._M_start + this->index_ % this->total_);
      local_3ac = kIdentity;
      match(&local_2a0,this,&local_3ac);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2a0.extra_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0.content_._M_dataplus._M_p != &local_2a0.content_.field_2) {
        operator_delete(local_2a0.content_._M_dataplus._M_p);
      }
      parse_array(this);
    }
    else {
      local_3ac = kIdentity;
      pAVar2 = AbstractSyntaxNode::add_child(this->current_,&local_3ac,pTVar1 + iVar3);
      this->current_ = pAVar2;
      AbstractSyntaxNode::add_child
                (pAVar2,(this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl
                        .super__Vector_impl_data._M_start + this->index_ % this->total_);
      local_3ac = kIdentity;
      match(&local_2f8,this,&local_3ac);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2f8.extra_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8.content_._M_dataplus._M_p != &local_2f8.content_.field_2) {
        operator_delete(local_2f8.content_._M_dataplus._M_p);
      }
    }
    this->current_ = this->current_->parent_;
  }
  local_3ac = kRightParen;
  match(&local_350,this,&local_3ac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_350.extra_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350.content_._M_dataplus._M_p != &local_350.content_.field_2) {
    operator_delete(local_350.content_._M_dataplus._M_p);
  }
  local_3ac = kSemicolon;
  match(&local_3a8,this,&local_3ac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a8.extra_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.content_._M_dataplus._M_p != &local_3a8.content_.field_2) {
    operator_delete(local_3a8.content_._M_dataplus._M_p);
  }
  this->current_ = this->current_->parent_;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void Parser::parse_read_statement() {
    current_ = current_->add_child(Token::Type::kReadStatement, forward_token());
    std::stringstream buffer;

    match(Token::Type::kRead);
    match(Token::Type::kLeftParen);
    if (forward_token().type() == Token::Type::kIdentity && forward_token(2).type() == Token::Type::kLeftBracket) {
        current_ = current_->add_child(Token::Type::kIdentityArray, forward_token());
        current_->add_child(forward_token());
        match(Token::Type::kIdentity);
        parse_array();
        current_ = current_->parent();
    } else if (forward_token().type() == Token::Type::kIdentity) {
        current_ = current_->add_child(Token::Type::kIdentity, forward_token());
        current_->add_child(forward_token());
        match(Token::Type::kIdentity);
        current_ = current_->parent();
    }
    match(Token::Type::kRightParen);
    match(Token::Type::kSemicolon);

    current_ = current_->parent();
}